

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O2

ssize_t __thiscall Record::read(Record *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  char *pcVar1;
  long lVar2;
  
  pcVar1 = (char *)CONCAT44(in_register_00000034,__fd);
  clear_buffer(this);
  this->record_number = (int)__buf;
  std::istream::seekg(pcVar1,(long)__buf * 400,0);
  for (lVar2 = 4; lVar2 != 0x194; lVar2 = lVar2 + 0x14) {
    std::istream::read(pcVar1,(long)(this->buffer + -1) + 0x10 + lVar2);
  }
  return *(ssize_t *)(pcVar1 + 8);
}

Assistant:

long Record::read(std::fstream& ins, long record_number) {
    clear_buffer();
    this->record_number = record_number;
    ins.seekg(ROWS * COLS * record_number);
    for (int i = 0; i < ROWS; ++i) {
        ins.read(buffer[i], COLS);
    }
    return ins.gcount();
}